

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse.c
# Opt level: O0

token * ignore_attribute(dmr_C *C,token *token,symbol *attr,decl_state *ctx)

{
  int iVar1;
  expression *local_30;
  expression *expr;
  decl_state *ctx_local;
  symbol *attr_local;
  token *token_local;
  dmr_C *C_local;
  
  local_30 = (expression *)0x0;
  expr = (expression *)ctx;
  ctx_local = (decl_state *)attr;
  attr_local = (symbol *)token;
  token_local = (token *)C;
  iVar1 = dmrC_match_op(token,0x28);
  if (iVar1 != 0) {
    attr_local = (symbol *)
                 dmrC_parens_expression
                           ((dmr_C *)token_local,(token *)attr_local,&local_30,"in attribute");
  }
  return (token *)attr_local;
}

Assistant:

static struct token *ignore_attribute(struct dmr_C *C, struct token *token, struct symbol *attr, struct decl_state *ctx)
{
        (void) ctx;
        (void) attr;
	struct expression *expr = NULL;
	if (dmrC_match_op(token, '('))
		token = dmrC_parens_expression(C, token, &expr, "in attribute");
	return token;
}